

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

char * zng_gzerror(gzFile file,int *errnum)

{
  int iVar1;
  char *pcVar2;
  
  if ((file == (gzFile)0x0) || ((file[1].have != 0x79b1 && (file[1].have != 0x1c4f)))) {
    return (char *)0x0;
  }
  iVar1 = *(int *)((long)&file[4].pos + 4);
  if (errnum != (int *)0x0) {
    *errnum = iVar1;
  }
  if (iVar1 == -4) {
    return "out of memory";
  }
  pcVar2 = "";
  if (*(char **)(file + 5) != (char *)0x0) {
    pcVar2 = *(char **)(file + 5);
  }
  return pcVar2;
}

Assistant:

const char * Z_EXPORT PREFIX(gzerror)(gzFile file, int *errnum) {
    gz_state *state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return NULL;
    state = (gz_state *)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return NULL;

    /* return error information */
    if (errnum != NULL)
        *errnum = state->err;
    return state->err == Z_MEM_ERROR ? "out of memory" : (state->msg == NULL ? "" : state->msg);
}